

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_async_from_sync_iterator_finalizer(JSRuntime *rt,JSValue val)

{
  JSValue v;
  JSValue v_00;
  JSValue obj;
  JSRuntime *rt_00;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  JSAsyncFromSyncIteratorData *s;
  void *in_stack_ffffffffffffffd8;
  
  obj.tag = in_RDX;
  obj.u.ptr = in_RSI.ptr;
  rt_00 = (JSRuntime *)JS_GetOpaque(obj,0x30);
  if (rt_00 != (JSRuntime *)0x0) {
    v.tag = (int64_t)in_RSI.ptr;
    v.u.ptr = in_RDI.ptr;
    JS_FreeValueRT(rt_00,v);
    v_00.tag = (int64_t)in_RSI.ptr;
    v_00.u.ptr = in_RDI.ptr;
    JS_FreeValueRT(rt_00,v_00);
    js_free_rt(rt_00,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void js_async_from_sync_iterator_finalizer(JSRuntime *rt, JSValue val)
{
    JSAsyncFromSyncIteratorData *s =
        JS_GetOpaque(val, JS_CLASS_ASYNC_FROM_SYNC_ITERATOR);
    if (s) {
        JS_FreeValueRT(rt, s->sync_iter);
        JS_FreeValueRT(rt, s->next_method);
        js_free_rt(rt, s);
    }
}